

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# efsw-test.c
# Opt level: O2

void handleFileAction(efsw_watcher watcher,efsw_watchid watchid,char *dir,char *filename,
                     efsw_action action,char *oldFilename,void *param)

{
  char cVar1;
  char *pcVar2;
  
  cVar1 = *oldFilename;
  pcVar2 = getActionName(action);
  if (cVar1 != '\0') {
    printf("Watch ID %ld DIR (%s) FILE (from file %s to %s) has event %s\n",watchid,dir,oldFilename,
           filename,pcVar2);
    return;
  }
  printf("Watch ID %ld DIR (%s) FILE (%s) has event %s\n",watchid,dir,filename,pcVar2);
  return;
}

Assistant:

void handleFileAction( efsw_watcher watcher, efsw_watchid watchid, 
						const char* dir, const char* filename,
						enum efsw_action action, const char* oldFilename,
						void* param ) {
	if ( strlen( oldFilename ) == 0 ) {
		printf( "Watch ID %ld DIR (%s) FILE (%s) has event %s\n", 
			watchid, dir, filename, getActionName( action ));
	} else {
		printf( "Watch ID %ld DIR (%s) FILE (from file %s to %s) has event %s\n",
			watchid, dir, oldFilename, filename, getActionName( action ));
	}
}